

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceListFieldsTest_MessageTest_Test::
~NoFieldPresenceListFieldsTest_MessageTest_Test
          (NoFieldPresenceListFieldsTest_MessageTest_Test *this)

{
  NoFieldPresenceListFieldsTest_MessageTest_Test *this_local;
  
  ~NoFieldPresenceListFieldsTest_MessageTest_Test(this);
  operator_delete(this,0x2e0);
  return;
}

Assistant:

TEST_F(NoFieldPresenceListFieldsTest, MessageTest) {
  // Message fields always have explicit presence.
  message_.mutable_optional_nested_message();
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());

  fields_.clear();
  message_.Clear();
  message_.mutable_optional_nested_message()->set_bb(123);
  r_->ListFields(message_, &fields_);
  EXPECT_EQ(1, fields_.size());
}